

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosString.cpp
# Opt level: O1

bool adios2::helper::GetParameter<std::__cxx11::string>(Params *params,string *key,string *value)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  const_iterator cVar4;
  _Rb_tree_header *p_Var5;
  size_type sVar6;
  
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&params->_M_t,key);
  p_Var5 = &(params->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar4._M_node != p_Var5) {
    std::__cxx11::string::_M_assign((string *)value);
    sVar1 = value->_M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (value->_M_dataplus)._M_p;
      sVar6 = 0;
      do {
        iVar3 = tolower((int)pcVar2[sVar6]);
        pcVar2[sVar6] = (char)iVar3;
        sVar6 = sVar6 + 1;
      } while (sVar1 != sVar6);
    }
  }
  return (_Rb_tree_header *)cVar4._M_node != p_Var5;
}

Assistant:

bool GetParameter(const Params &params, const std::string &key, std::string &value)
{
    auto it = params.find(key);
    if (it != params.end())
    {
        value = it->second;
        std::transform(value.begin(), value.end(), value.begin(), ::tolower);
        return true;
    }
    return false;
}